

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Parse_CachedDigitDs_RE2(int i)

{
  Parse3DigitDs(i,Parse3CachedRE2);
  return;
}

Assistant:

void Parse_CachedDigitDs_RE2(int i)         { Parse3DigitDs(i, Parse3CachedRE2); }